

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseRowGroup(TidyDocImpl *doc,Node *rowgroup,GetTokenMode mode)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  Bool BVar3;
  Node *node;
  TidyDocImpl *pTVar4;
  Dict *pDVar5;
  uint uVar6;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *node_00;
  TidyParserMemory memory;
  
  pLVar2 = doc->lexer;
  if (rowgroup == (Node *)0x0) {
    prvTidypopMemory(doc);
    rowgroup = memory.original_node;
  }
  else {
    memory.reentry_state = 0;
    if ((rowgroup->tag->model & 1) != 0) {
      return (Node *)0x0;
    }
  }
  do {
    while( true ) {
      do {
        do {
          while (memory.reentry_state != 0) {
            if (memory.reentry_state != 1) {
              if (memory.reentry_state == 2) {
                return (Node *)0x0;
              }
              do {
              } while( true );
            }
            pLVar2->exiled = no;
            memory.reentry_state = 0;
          }
          node = prvTidyGetToken(doc,IgnoreWhitespace);
          memory.reentry_state = 2;
        } while (node == (Node *)0x0);
        pDVar5 = node->tag;
        if (pDVar5 == (((TidyDocImpl *)rowgroup)->root).tag) {
          if (node->type == EndTag) {
            (((TidyDocImpl *)rowgroup)->root).closed = yes;
            prvTidyFreeNode(doc,node);
            return (Node *)0x0;
          }
          goto LAB_0013d30d;
        }
        if (((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_TABLE)) && (node->type == EndTag))
        goto LAB_0013d30d;
        BVar3 = InsertMisc(rowgroup,node);
        memory.reentry_state = 0;
      } while (BVar3 != no);
      if (node->tag != (Dict *)0x0) break;
      if (node->type != TextNode) goto LAB_0013d28b;
LAB_0013d1de:
      BVar3 = prvTidynodeIsText(node);
      node_00 = extraout_RDX;
      if ((BVar3 == no) &&
         (BVar3 = prvTidynodeHasCM(node,0x18), node_00 = extraout_RDX_00, BVar3 == no)) {
        if ((node->tag->model & 4) == 0) goto LAB_0013d187;
        memory.reentry_state = 0;
        prvTidyReport(doc,rowgroup,node,0x27e);
        MoveToHead(doc,rowgroup,node);
      }
      else {
        MoveBeforeTable((TidyDocImpl *)rowgroup,node,node_00);
        prvTidyReport(doc,rowgroup,node,0x27e);
        pLVar2->exiled = yes;
        memory.reentry_state = 1;
        if (node->type != TextNode) {
          memory.reentry_mode = IgnoreWhitespace;
          memory.reentry_state = 1;
LAB_0013d3a0:
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT3248(CONCAT824(memory._24_8_,
                                                   CONCAT816(node,CONCAT88(rowgroup,
                                                  prvTidyParseRowGroup)))));
          return node;
        }
      }
    }
    if (node->type != EndTag) {
      TVar1 = node->tag->id;
      if ((TVar1 != TidyTag_TH) && (TVar1 != TidyTag_TD)) goto LAB_0013d1de;
      prvTidyUngetToken(doc);
      node = prvTidyInferredTag(doc,TidyTag_TR);
      prvTidyReport(doc,rowgroup,node,0x261);
    }
LAB_0013d187:
    pDVar5 = node->tag;
    if (node->type == EndTag) {
      if ((pDVar5 == (Dict *)0x0) || (pDVar5->id != TidyTag_FORM)) {
        BVar3 = prvTidynodeHasCM(node,0x18);
        pDVar5 = node->tag;
        if (BVar3 == no) {
          pTVar4 = (TidyDocImpl *)rowgroup;
          if (((pDVar5 == (Dict *)0x0) || (uVar6 = pDVar5->id - TidyTag_TD, 6 < uVar6)) ||
             ((0x49U >> (uVar6 & 0x1f) & 1) == 0)) {
            while (pTVar4 = (TidyDocImpl *)(pTVar4->root).parent, pTVar4 != (TidyDocImpl *)0x0) {
              if (pDVar5 == (pTVar4->root).tag) goto LAB_0013d30d;
            }
            goto LAB_0013d26e;
          }
        }
        else if ((pDVar5 != (Dict *)0x0) && (pDVar5->id == TidyTag_FORM)) goto LAB_0013d1c9;
      }
      else {
LAB_0013d1c9:
        *(byte *)&doc->badForm = (byte)doc->badForm | 1;
      }
    }
    else {
LAB_0013d26e:
      if ((pDVar5->model & 0x100) == 0) {
        if (node->type != EndTag) {
          if (pDVar5->id != TidyTag_TR) {
            node = prvTidyInferredTag(doc,TidyTag_TR);
            prvTidyReport(doc,rowgroup,node,0x261);
            prvTidyUngetToken(doc);
          }
          prvTidyInsertNodeAtEnd(rowgroup,node);
          memory.reentry_mode = IgnoreWhitespace;
          memory.reentry_state = 0;
          goto LAB_0013d3a0;
        }
      }
      else if (node->type != EndTag) {
LAB_0013d30d:
        prvTidyUngetToken(doc);
        return (Node *)0x0;
      }
    }
LAB_0013d28b:
    memory.reentry_state = 0;
    prvTidyReport(doc,rowgroup,node,0x235);
    prvTidyFreeNode(doc,node);
  } while( true );
}

Assistant:

Node* TY_(ParseRowGroup)( TidyDocImpl* doc, Node *rowgroup, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NOT_TEXTNODE,      /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( rowgroup == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        rowgroup = memory.original_node;
        state = memory.reentry_state;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(rowgroup);
        if (rowgroup->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
            node = TY_(GetToken)(doc, IgnoreWhitespace);
        
        switch (state)
        {
            case STATE_INITIAL:
            {
                TidyParserMemory memory = {0};

                if (node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if (node->tag == rowgroup->tag)
                {
                    if (node->type == EndTag)
                    {
                        rowgroup->closed = yes;
                        TY_(FreeNode)( doc, node);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* if </table> infer end tag */
                if ( nodeIsTABLE(node) && node->type == EndTag )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /* deal with comments etc. */
                if (InsertMisc(rowgroup, node))
                    continue;

                /* discard unknown tags */
                if (node->tag == NULL && node->type != TextNode)
                {
                    TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if TD or TH then infer <TR>
                  if text or inline or block move before table
                  if head content move to head
                */

                if (node->type != EndTag)
                {
                    if ( nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_TR);
                        TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
                    }
                    else if ( TY_(nodeIsText)(node)
                              || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        MoveBeforeTable( doc, rowgroup, node );
                        TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                        lexer->exiled = yes;

                        if (node->type != TextNode)
                        {
                            memory.identity = TY_(ParseRowGroup);
                            memory.original_node = rowgroup;
                            memory.reentry_node = node;
                            memory.reentry_state = STATE_POST_NOT_TEXTNODE;
                            TY_(pushMemory)( doc, memory );
                            DEBUG_LOG_EXIT_WITH_NODE(node);
                            return node;
                        }
                        
                        state = STATE_POST_NOT_TEXTNODE;
                        continue;
                    }
                    else if (node->tag->model & CM_HEAD)
                    {
                        TY_(Report)(doc, rowgroup, node, TAG_NOT_ALLOWED_IN);
                        MoveToHead(doc, rowgroup, node);
                        continue;
                    }
                }

                /*
                  if this is the end tag for ancestor element
                  then infer end tag for this element
                */
                if (node->type == EndTag)
                {
                    if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        if ( nodeIsFORM(node) )
                            BadForm( doc );

                        TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( nodeIsTR(node) || nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    for ( parent = rowgroup->parent;
                          parent != NULL;
                          parent = parent->parent )
                    {
                        if (node->tag == parent->tag)
                        {
                            TY_(UngetToken)( doc );
                            DEBUG_LOG_EXIT;
                            return NULL;
                        }
                    }
                }

                /*
                  if THEAD, TFOOT or TBODY then implied end tag

                */
                if (node->tag->model & CM_ROWGRP)
                {
                    if (node->type != EndTag)
                    {
                        TY_(UngetToken)( doc );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, rowgroup, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                if ( !nodeIsTR(node) )
                {
                    node = TY_(InferredTag)(doc, TidyTag_TR);
                    TY_(Report)(doc, rowgroup, node, MISSING_STARTTAG);
                    TY_(UngetToken)( doc );
                }

               /* node should be <TR> */
                TY_(InsertNodeAtEnd)(rowgroup, node);
                memory.identity = TY_(ParseRowGroup);
                memory.original_node = rowgroup;
                memory.reentry_node = node;
                memory.reentry_state = STATE_INITIAL;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            } break;
                
                
            case STATE_POST_NOT_TEXTNODE:
            {
                lexer->exiled = no;
                state = STATE_INITIAL;
                continue;
            } break;

                
            default:
                break;
        } /* switch */
    } /* while */
    DEBUG_LOG_EXIT;
    return NULL;
}